

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O0

void map_bucket_swap(nghttp2_map_bucket *bkt,uint32_t *phash,nghttp2_map_key_type *pkey,void **pdata
                    )

{
  uint32_t uVar1;
  nghttp2_map_key_type nVar2;
  void *pvVar3;
  void *data;
  nghttp2_map_key_type key;
  uint32_t h;
  void **pdata_local;
  nghttp2_map_key_type *pkey_local;
  uint32_t *phash_local;
  nghttp2_map_bucket *bkt_local;
  
  uVar1 = bkt->hash;
  nVar2 = bkt->key;
  pvVar3 = bkt->data;
  bkt->hash = *phash;
  bkt->key = *pkey;
  bkt->data = *pdata;
  *phash = uVar1;
  *pkey = nVar2;
  *pdata = pvVar3;
  return;
}

Assistant:

static void map_bucket_swap(nghttp2_map_bucket *bkt, uint32_t *phash,
                            nghttp2_map_key_type *pkey, void **pdata) {
  uint32_t h = bkt->hash;
  nghttp2_map_key_type key = bkt->key;
  void *data = bkt->data;

  bkt->hash = *phash;
  bkt->key = *pkey;
  bkt->data = *pdata;

  *phash = h;
  *pkey = key;
  *pdata = data;
}